

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_detach(LINK_HANDLE link,_Bool close,char *error_condition,char *error_description,
               AMQP_VALUE info)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  ERROR_HANDLE error;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE info_local;
  char *error_description_local;
  char *error_condition_local;
  _Bool close_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_detach",0x4ce,1,"NULL link");
    }
    l._4_4_ = 0x4cf;
  }
  else if ((link->is_closed & 1U) == 0) {
    if (error_condition == (char *)0x0) {
      l_1 = (LOGGER_LOG)0x0;
    }
    else {
      l_1 = (LOGGER_LOG)error_create(error_condition);
      if ((ERROR_HANDLE)l_1 == (ERROR_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_detach",0x4de,1,
                    "Cannot create error for detach, detaching without error anyhow");
        }
      }
      else {
        if (((error_description != (char *)0x0) &&
            (iVar1 = error_set_description((ERROR_HANDLE)l_1,error_description), iVar1 != 0)) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_detach",0x4e6,1,
                    "Cannot set error description on detach error, detaching anyhow");
        }
        if (((info != (AMQP_VALUE)0x0) &&
            (iVar1 = error_set_info((ERROR_HANDLE)l_1,info), iVar1 != 0)) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_detach",0x4ee,1,"Cannot set info map on detach error, detaching anyhow");
        }
      }
    }
    switch(link->link_state) {
    case LINK_STATE_DETACHED:
      l._4_4_ = 0;
      break;
    case LINK_STATE_HALF_ATTACHED_ATTACH_SENT:
    case LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED:
      iVar1 = send_detach(link,close,(ERROR_HANDLE)l_1);
      if (iVar1 == 0) {
        set_link_state(link,LINK_STATE_DETACHED);
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_detach",0x4ff,1,"Sending detach frame failed");
        }
        l._4_4_ = 0x500;
      }
      break;
    case LINK_STATE_ATTACHED:
      iVar1 = send_detach(link,close,(ERROR_HANDLE)l_1);
      if (iVar1 == 0) {
        set_link_state(link,LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_detach",0x50d,1,"Sending detach frame failed");
        }
        l._4_4_ = 0x50e;
      }
      break;
    default:
      l._4_4_ = 0x51f;
    }
    if (l_1 != (LOGGER_LOG)0x0) {
      error_destroy((ERROR_HANDLE)l_1);
    }
  }
  else {
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int link_detach(LINK_HANDLE link, bool close, const char* error_condition, const char* error_description, AMQP_VALUE info)
{
    int result;

    (void)error_condition;
    (void)error_description;
    (void)info;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else if (link->is_closed)
    {
        result = 0;
    }
    else
    {
        ERROR_HANDLE error;

        if (error_condition != NULL)
        {
            error = error_create(error_condition);
            if (error == NULL)
            {
                LogInfo("Cannot create error for detach, detaching without error anyhow");
            }
            else
            {
                if (error_description != NULL)
                {
                    if (error_set_description(error, error_description) != 0)
                    {
                        LogInfo("Cannot set error description on detach error, detaching anyhow");
                    }
                }

                if (info != NULL)
                {
                    if (error_set_info(error, info) != 0)
                    {
                        LogInfo("Cannot set info map on detach error, detaching anyhow");
                    }
                }
            }
        }
        else
        {
            error = NULL;
        }

        switch (link->link_state)
        {
        case LINK_STATE_HALF_ATTACHED_ATTACH_SENT:
        case LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED:
            /* Sending detach when remote is not yet attached */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_DETACHED);
                result = 0;
            }
            break;

        case LINK_STATE_ATTACHED:
            /* Send detach and wait for remote to respond */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
                result = 0;
            }
            break;

        case LINK_STATE_DETACHED:
            /* Already detached */
            result = 0;
            break;

        default:
        case LINK_STATE_ERROR:
            /* Already detached and in error state */
            result = MU_FAILURE;
            break;
        }

        if (error != NULL)
        {
            error_destroy(error);
        }
    }

    return result;
}